

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::
     SplitStringToIteratorAllowEmpty<std::__cxx11::string,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *full,char *delim,
               int pieces,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *result)

{
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pbVar1;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  value_type local_c0;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  value_type local_98;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  value_type local_60;
  int local_3c;
  long lStack_38;
  int i;
  size_type end_index;
  size_type begin_index;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result_local;
  char *pcStack_18;
  int pieces_local;
  char *delim_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *full_local;
  
  end_index = 0;
  local_3c = 0;
  begin_index = (size_type)result;
  result_local._4_4_ = pieces;
  pcStack_18 = delim;
  delim_local = (char *)full;
  while( true ) {
    if (result_local._4_4_ + -1 <= local_3c && result_local._4_4_ != 0) {
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)delim_local);
      local_c8 = std::
                 back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)begin_index,0);
      pbVar1 = std::
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c8);
      std::
      back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(pbVar1,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      return;
    }
    lStack_38 = std::__cxx11::string::find_first_of(delim_local,(ulong)pcStack_18);
    if (lStack_38 == -1) break;
    std::__cxx11::string::substr((ulong)&local_98,(ulong)delim_local);
    local_a0 = std::
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)begin_index,0);
    pbVar1 = std::
             back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_a0);
    std::
    back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(pbVar1,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    end_index = lStack_38 + 1;
    local_3c = local_3c + 1;
  }
  std::__cxx11::string::substr((ulong)&local_60,(ulong)delim_local);
  local_68 = std::
             back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator++((back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)begin_index,0);
  pbVar1 = std::
           back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_68);
  std::
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(pbVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

static inline
void SplitStringToIteratorAllowEmpty(const StringType& full,
                                     const char* delim,
                                     int pieces,
                                     ITR& result) {
  string::size_type begin_index, end_index;
  begin_index = 0;

  for (int i = 0; (i < pieces-1) || (pieces == 0); i++) {
    end_index = full.find_first_of(delim, begin_index);
    if (end_index == string::npos) {
      *result++ = full.substr(begin_index);
      return;
    }
    *result++ = full.substr(begin_index, (end_index - begin_index));
    begin_index = end_index + 1;
  }
  *result++ = full.substr(begin_index);
}